

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall QLocale::amText(QString *__return_storage_ptr__,QLocale *this)

{
  QLocaleData *pQVar1;
  QSystemLocale *pQVar2;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = ((this->d).d.ptr)->m_data;
  if (pQVar1 == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    local_58._16_8_ = 0;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_40 = 2;
    (*pQVar2->_vptr_QSystemLocale[2])(&local_38,pQVar2,0x1b);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_38);
    ::QVariant::~QVariant((QVariant *)&local_38);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_002de2b8;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
    pQVar1 = ((this->d).d.ptr)->m_data;
  }
  local_38.shared =
       (PrivateShared *)
       ((ulong)pQVar1->m_anteMeridiem_size << 0x20 | (ulong)pQVar1->m_anteMeridiem_idx);
  QLocaleData::DataRange::getData
            (__return_storage_ptr__,(DataRange *)&local_38.shared,
             L"AMvm.a.gANe paraditesጥዋትصde la mañanaicheheavoАМsárúwáI bikɛ̂glàuluchelopamilauभोरफुंprijepodneприје поднеA.M.пр.об.နံနက်上午a.\xa0m.Zdat azalب.نᏌᎾᎴUhr vörmiddaachsa.m.dop.सवेरidiɓaསྔ་ཆ་KI𐐈𐐣𐑨𐑥atmŋdikíkírígap.matinsubaka𞤀𞤎LEEBIπ.μ.MambiaSafiyade.f.h.N’ụtụtụip.ante midír.n.午前Isukn tufatkaroonĨyakwakyaاے ایمये एमKirokoसकाळींsokallim오전AdduhaBNmanáтаңкыTOOກ່ອນທ່ຽງpriekšpusdienāntɔ́ngɔ́priešpietdopołdnjaDindaODmoiesпретпл.utukowichishuMuhiPGএ এমƐnkakɛnyáRŨү.ө.ᠦ᠂ ᠥcommeǁgoagasपूर्वाह्नmbaʼámbaʼmbaꞌmbaꞌFọ mọ́ninߛiđitbeaivetibf.m.RWWDӕмбисбоны размӕغ.م.قبل\x200cازظهرda manhãankstāinanਪੂ.ਦੁ.kang’amaZ.MU.ЭИTesiranNDLwamilawuᱥᱮᱛᱟᱜprije podnemakeoꎸꄑdo połedniŏصبح، منجهندसुबुह जाපෙ.ව.MunkyoGHHosengⵜⵉⴼⴰⵡⵜfmam Vormittag܏ܩܛ\x200ctifawtLuma lwa KSubbaahiTaparachuก่อนเที่ยงསྔ་དྲོ་ቅ.ቀ.hengihengiÖÖgünortadan öňдпچۈشتىن بۇرۇنТОSAybkiɛmɛ́ɛmפֿאַרמיטאָגÀárọ̀Àárɔ̀banhaetतडकेसबेरेpi open sunoʊshilè kʊboɖuभ्यागाए एमଏ ଏମఎ ఎమ్ᐁᒼ"
            );
LAB_002de2b8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::amText() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::AMText).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    return d->m_data->anteMeridiem().getData(am_data);
}